

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* Tools::string_split(string *to_split,char *delimiters,char *to_trim)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  undefined8 in_RDX;
  is_any_ofF<char> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *results;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char **in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar1;
  token_compress_mode_type eCompress;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Input;
  
  eCompress = (token_compress_mode_type)((ulong)in_RDX >> 0x20);
  uVar1 = 0;
  this = in_RDI;
  Input = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1912e5);
  boost::algorithm::is_any_of<char_const*>(in_stack_ffffffffffffff98);
  boost::algorithm::trim_if<std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
            (in_RCX,(is_any_ofF<char> *)CONCAT17(uVar1,in_stack_ffffffffffffffd8));
  boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF((is_any_ofF<char> *)this);
  boost::algorithm::is_any_of<char_const*>(in_stack_ffffffffffffff98);
  boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
            (unaff_retaddr,Input,in_RSI,eCompress);
  boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF((is_any_ofF<char> *)this);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::string> Tools::string_split(std::string &to_split, const char *delimiters, const char *to_trim) {
    std::vector<std::string> results;
    boost::trim_if(to_split, boost::is_any_of(to_trim));
    boost::split(results, to_split, boost::is_any_of(delimiters), boost::token_compress_on);
    return results;
}